

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

string * Catch::Matchers::Detail::describe_multi_matcher
                   (StringRef combine,string *descriptions_begin,string *descriptions_end)

{
  StringRef rhs;
  bool bVar1;
  string *lhs;
  string *in_RCX;
  string *in_RDI;
  string *in_R8;
  string *desc_1;
  bool first;
  string *desc;
  size_t combined_size;
  string *description;
  string *psVar2;
  string *local_58;
  string *local_40;
  StringRef local_18;
  
  psVar2 = in_RDI;
  std::__cxx11::string::string((string *)in_RDI);
  for (local_40 = in_RCX; local_40 != in_R8; local_40 = local_40 + 0x20) {
    std::__cxx11::string::size();
  }
  lhs = (string *)(((long)in_R8 - (long)in_RCX >> 5) + -1);
  StringRef::size(&local_18);
  std::__cxx11::string::reserve((ulong)in_RDI);
  std::__cxx11::string::operator+=((string *)in_RDI,"( ");
  bVar1 = true;
  for (local_58 = in_RCX; local_58 != in_R8; local_58 = local_58 + 0x20) {
    if (bVar1) {
      bVar1 = false;
    }
    else {
      rhs.m_size = (size_type)psVar2;
      rhs.m_start = (char *)in_RDI;
      operator+=(lhs,rhs);
    }
    std::__cxx11::string::operator+=((string *)in_RDI,local_58);
  }
  std::__cxx11::string::operator+=((string *)in_RDI," )");
  return psVar2;
}

Assistant:

std::string describe_multi_matcher(StringRef combine, std::string const* descriptions_begin, std::string const* descriptions_end) {
            std::string description;
            std::size_t combined_size = 4;
            for ( auto desc = descriptions_begin; desc != descriptions_end; ++desc ) {
                combined_size += desc->size();
            }
            combined_size += static_cast<size_t>(descriptions_end - descriptions_begin - 1) * combine.size();

            description.reserve(combined_size);

            description += "( ";
            bool first = true;
            for( auto desc = descriptions_begin; desc != descriptions_end; ++desc ) {
                if( first )
                    first = false;
                else
                    description += combine;
                description += *desc;
            }
            description += " )";
            return description;
        }